

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void duckdb::RLEScanPartialInternal<unsigned_int,false>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  uint uVar1;
  undefined4 uVar2;
  idx_t iVar3;
  data_ptr_t pdVar4;
  _func_int **pp_Var5;
  _func_int **pp_Var6;
  pointer pSVar7;
  data_ptr_t pdVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  pSVar7 = unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
           ::operator->(&state->scan_state);
  pdVar8 = BufferHandle::Ptr((BufferHandle *)(pSVar7 + 1));
  iVar3 = segment->offset;
  uVar1 = *(uint *)&pSVar7[6]._vptr_SegmentScanState;
  pdVar4 = result->data;
  Vector::SetVectorType(result,FLAT_VECTOR);
  uVar11 = scan_count + result_offset;
  while( true ) {
    uVar9 = uVar11 - result_offset;
    if (uVar11 < result_offset || uVar9 == 0) {
      return;
    }
    pp_Var5 = pSVar7[4]._vptr_SegmentScanState;
    pp_Var6 = pSVar7[5]._vptr_SegmentScanState;
    uVar10 = (ulong)*(ushort *)(pdVar8 + (long)pp_Var5 * 2 + uVar1 + iVar3) - (long)pp_Var6;
    uVar2 = *(undefined4 *)(pdVar8 + (long)pp_Var5 * 4 + iVar3 + 8);
    if (uVar9 < uVar10) break;
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined4 *)(pdVar4 + uVar9 * 4 + result_offset * 4) = uVar2;
    }
    result_offset = result_offset + uVar10;
    pSVar7[4]._vptr_SegmentScanState = (_func_int **)((long)pp_Var5 + 1);
    pSVar7[5]._vptr_SegmentScanState = (_func_int **)0x0;
  }
  for (; uVar11 != result_offset; result_offset = result_offset + 1) {
    *(undefined4 *)(pdVar4 + result_offset * 4) = uVar2;
  }
  pSVar7[5]._vptr_SegmentScanState = (_func_int **)((long)pp_Var6 + uVar9);
  return;
}

Assistant:

void RLEScanPartialInternal(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                            idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<RLEScanState<T>>();

	auto data = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto data_pointer = reinterpret_cast<T *>(data + RLEConstants::RLE_HEADER_SIZE);
	auto index_pointer = reinterpret_cast<rle_count_t *>(data + scan_state.rle_count_offset);

	// If we are scanning an entire Vector and it contains only a single run
	if (CanEmitConstantVector<ENTIRE_VECTOR>(scan_state.position_in_entry, index_pointer[scan_state.entry_pos],
	                                         scan_count)) {
		RLEScanConstant<T>(scan_state, index_pointer, data_pointer, scan_count, result);
		return;
	}

	auto result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	idx_t result_end = result_offset + scan_count;
	while (result_offset < result_end) {
		rle_count_t run_end = index_pointer[scan_state.entry_pos];
		idx_t run_count = run_end - scan_state.position_in_entry;
		idx_t remaining_scan_count = result_end - result_offset;
		T element = data_pointer[scan_state.entry_pos];
		if (DUCKDB_UNLIKELY(run_count > remaining_scan_count)) {
			for (idx_t i = 0; i < remaining_scan_count; i++) {
				result_data[result_offset + i] = element;
			}
			scan_state.position_in_entry += remaining_scan_count;
			break;
		}

		for (idx_t i = 0; i < run_count; i++) {
			result_data[result_offset + i] = element;
		}

		result_offset += run_count;
		scan_state.ForwardToNextRun();
	}
}